

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.cpp
# Opt level: O0

bool __thiscall CSounds::IsPlaying(CSounds *this,int SetId)

{
  long lVar1;
  CDataSoundset *pCVar2;
  uint uVar3;
  ISound *pIVar4;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  CDataSoundset *pSet;
  int local_2c;
  bool local_d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((*(byte *)(in_RDI + 0x148) & 1) == 0) && (-1 < in_ESI)) && (in_ESI < g_pData->m_NumSounds))
  {
    pCVar2 = g_pData->m_aSounds;
    for (local_2c = 0; local_2c < pCVar2[in_ESI].m_NumSounds; local_2c = local_2c + 1) {
      pIVar4 = CComponent::Sound((CComponent *)0x1c2c74);
      uVar3 = (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
                        (pIVar4,(ulong)(uint)pCVar2[in_ESI].m_aSounds[local_2c].m_Id.m_Id);
      if ((uVar3 & 1) != 0) {
        local_d = true;
        goto LAB_001c2cbd;
      }
    }
    local_d = false;
  }
  else {
    local_d = false;
  }
LAB_001c2cbd:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_d;
  }
  __stack_chk_fail();
}

Assistant:

bool CSounds::IsPlaying(int SetId)
{
	if(m_WaitForSoundJob || SetId < 0 || SetId >= g_pData->m_NumSounds)
		return false;

	CDataSoundset *pSet = &g_pData->m_aSounds[SetId];
	for(int i = 0; i < pSet->m_NumSounds; i++)
	{
		if(Sound()->IsPlaying(pSet->m_aSounds[i].m_Id))
			return true;
	}
	return false;
}